

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ipc::Deferred<perfetto::protos::gen::ObserveEventsResponse>::Deferred
          (Deferred<perfetto::protos::gen::ObserveEventsResponse> *this,DeferredBase *other)

{
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  (this->super_DeferredBase).callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_DeferredBase).callback_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->super_DeferredBase).callback_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_DeferredBase).callback_.super__Function_base._M_functor + 8) =
       0;
  ::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::operator=
            ((function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)> *)this,
             &other->callback_);
  std::function<void_(perfetto::ipc::AsyncResult<protozero::CppMessageObj>)>::operator=
            (&other->callback_,(nullptr_t)0x0);
  return;
}

Assistant:

explicit Deferred(DeferredBase&& other) {
    callback_ = std::move(other.callback_);
    other.callback_ = nullptr;
  }